

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestGetTexParameter::initTestRuns(TextureViewTestGetTexParameter *this)

{
  pointer *pp_Var1;
  GLenum texture_target;
  iterator __position;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  GLint texture_depth;
  uint uVar7;
  uint uVar8;
  GLuint *pGVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  GLuint GVar13;
  _test_run local_a8;
  GLuint local_78;
  GLint parent_n_immutable_levels;
  GLint parent_num_levels;
  GLint parent_num_layers;
  GLint parent_min_layer;
  GLint parent_min_level;
  ulong local_60;
  uint local_58;
  _test_texture_type local_54;
  ulong local_50;
  ulong local_48;
  vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
  *local_40;
  TextureViewTestGetTexParameter *local_38;
  Functions *gl;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  local_40 = (vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
              *)&this->m_test_runs;
  lVar10 = 0;
  local_38 = this;
  do {
    local_54 = (&DAT_01a9a830)[lVar10];
    uVar2 = (uint)lVar10;
    local_58 = uVar2 - 3;
    local_50 = 0;
    do {
      local_a8.expected_n_num_levels = 0;
      local_a8.parent_texture_object_id = 0;
      local_a8.texture_view_object_created_from_immutable_to_id = 0;
      local_a8.texture_view_object_created_from_view_to_id = 0;
      local_a8.expected_n_immutable_levels = 0;
      local_a8.expected_n_min_layer = 0;
      local_a8.expected_n_min_level = 0;
      local_a8.expected_n_num_layers = 0;
      texture_target = (&DAT_01a9a800)[local_50];
      local_a8.texture_type = local_54;
      uVar3 = (uint)local_50;
      uVar7 = uVar3 - 7;
      uVar8 = 2;
      if (uVar7 < 2) {
        uVar8 = 0xc;
      }
      if (local_50 == 7) {
        uVar8 = 6;
      }
      local_48 = (ulong)uVar8;
      local_60 = CONCAT71(local_60._1_7_,uVar3 - 9 < 0xfffffffe);
      bVar11 = (local_50 & 9) != 0;
      local_78 = (uint)((uVar3 & 0xe) != 4) * 2;
      bVar12 = local_50 != 9;
      if (!bVar12) {
        local_78 = 0;
      }
      if (!bVar12 || !bVar11) {
        local_48 = 1;
      }
      local_a8.texture_target = texture_target;
      (*gl->genTextures)(1,&local_a8.parent_texture_object_id);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glGenTextures() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0xaf7);
      (*gl->bindTexture)(texture_target,local_a8.parent_texture_object_id);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glBindTexture() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0xafa);
      if (lVar10 != 0) {
        texture_depth = 0x10;
        if (uVar7 < 2) {
          texture_depth = 0x40;
        }
        TextureViewUtilities::initTextureStorage
                  (gl,lVar10 == 2,texture_target,texture_depth,(uint)(uVar7 < 2) * 0x20 + 0x20,0x40,
                   0x8058,0x1908,0x1401,6,4,0);
        if ((uVar2 < 5) && ((0x1aU >> (uVar2 & 0x1f) & 1) != 0)) {
          local_a8.expected_n_immutable_levels = 6;
          local_a8.expected_n_num_layers = 1;
          local_a8.expected_n_num_levels = 6;
          if ((int)texture_target < 0x8c1a) {
            if (texture_target == 0x84f5) {
LAB_00a2171d:
              local_a8.expected_n_immutable_levels = 1;
              local_a8.expected_n_num_levels = 1;
            }
            else if (texture_target == 0x8513) {
              local_a8.expected_n_num_layers = 6;
            }
            else if (texture_target == 0x8c18) {
              local_a8.expected_n_num_layers = 0x20;
            }
          }
          else if ((int)texture_target < 0x9100) {
            if (texture_target == 0x8c1a) {
              local_a8.expected_n_num_layers = 0x10;
            }
            else if (texture_target == 0x9009) {
              local_a8.expected_n_num_layers = 0x18;
            }
          }
          else {
            if (texture_target == 0x9100) goto LAB_00a2171d;
            if (texture_target == 0x9102) {
              local_a8.expected_n_immutable_levels = 1;
              local_a8.expected_n_num_layers = 0x10;
              local_a8.expected_n_num_levels = 1;
            }
          }
          if (local_58 < 2) {
            local_60 = (ulong)((byte)local_60 & (bVar12 && bVar11));
            bVar11 = true;
            do {
              bVar12 = bVar11;
              bVar4 = ~bVar12;
              pGVar9 = &local_a8.texture_view_object_created_from_view_to_id;
              if (bVar12) {
                pGVar9 = &local_a8.texture_view_object_created_from_immutable_to_id;
              }
              (*gl->genTextures)(1,pGVar9);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glGenTextures() call failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb71);
              GVar13 = (GLuint)local_60;
              (*gl->textureView)((&local_a8.texture_view_object_created_from_immutable_to_id)[bVar4]
                                 ,local_a8.texture_target,
                                 (&local_a8.parent_texture_object_id)[bVar4],0x8058,local_78,3,
                                 GVar13,(GLuint)local_48);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glTextureView() call failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb76);
              parent_min_level = -1;
              parent_min_layer = -1;
              parent_num_layers = -1;
              parent_num_levels = -1;
              parent_n_immutable_levels = -1;
              (*gl->bindTexture)(texture_target,(&local_a8.parent_texture_object_id)[bVar4]);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glBindTexture() call failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb80);
              (*gl->getTexParameteriv)(texture_target,0x82df,&parent_n_immutable_levels);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,
                              "glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb85);
              (*gl->getTexParameteriv)(texture_target,0x82dd,&parent_min_layer);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,
                              "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb8a);
              (*gl->getTexParameteriv)(texture_target,0x82db,&parent_min_level);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,
                              "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb8f);
              (*gl->getTexParameteriv)(texture_target,0x82de,&parent_num_layers);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,
                              "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb94);
              (*gl->getTexParameteriv)(texture_target,0x82dc,&parent_num_levels);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,
                              "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                              ,0xb99);
              local_a8.expected_n_min_level = parent_min_level + local_78;
              local_a8.expected_n_num_layers = parent_num_layers - GVar13;
              if ((int)local_48 <= (int)(parent_num_layers - GVar13)) {
                local_a8.expected_n_num_layers = (int)local_48;
              }
              local_a8.expected_n_num_levels = parent_num_levels - local_78;
              if (2 < local_a8.expected_n_num_levels) {
                local_a8.expected_n_num_levels = 3;
              }
              local_a8.expected_n_min_layer = parent_min_layer + GVar13;
              local_a8.expected_n_immutable_levels = parent_n_immutable_levels;
            } while ((lVar10 == 4) && (bVar11 = false, bVar12));
          }
        }
      }
      __position._M_current =
           (local_38->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_38->m_test_runs).
          super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
        ::_M_realloc_insert<gl4cts::TextureViewTestGetTexParameter::_test_run_const&>
                  (local_40,__position,&local_a8);
      }
      else {
        (__position._M_current)->texture_target = local_a8.texture_target;
        (__position._M_current)->texture_type = local_a8.texture_type;
        (__position._M_current)->expected_n_num_levels = local_a8.expected_n_num_levels;
        (__position._M_current)->parent_texture_object_id = local_a8.parent_texture_object_id;
        (__position._M_current)->texture_view_object_created_from_immutable_to_id =
             local_a8.texture_view_object_created_from_immutable_to_id;
        (__position._M_current)->texture_view_object_created_from_view_to_id =
             local_a8.texture_view_object_created_from_view_to_id;
        (__position._M_current)->expected_n_immutable_levels = local_a8.expected_n_immutable_levels;
        (__position._M_current)->expected_n_min_layer = local_a8.expected_n_min_layer;
        (__position._M_current)->expected_n_min_level = local_a8.expected_n_min_level;
        (__position._M_current)->expected_n_num_layers = local_a8.expected_n_num_layers;
        pp_Var1 = &(local_38->m_test_runs).
                   super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      local_50 = local_50 + 1;
    } while (local_50 != 10);
    lVar10 = lVar10 + 1;
    if (lVar10 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void TextureViewTestGetTexParameter::initTestRuns()
{
	const glw::Functions& gl				= m_context.getRenderContext().getFunctions();
	const int			  n_cubemaps_needed = 4; /* only used for GL_TEXTURE_CUBE_MAP_ARRAY */
	const int			  texture_depth		= 16;
	const int			  texture_height	= 32;
	const int			  texture_width		= 64;

	const glw::GLenum texture_targets[] = {
		GL_TEXTURE_1D,		 GL_TEXTURE_1D_ARRAY,		GL_TEXTURE_2D,
		GL_TEXTURE_2D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
		GL_TEXTURE_3D,		 GL_TEXTURE_CUBE_MAP,		GL_TEXTURE_CUBE_MAP_ARRAY,
		GL_TEXTURE_RECTANGLE
	};
	const _test_texture_type texture_types[] = { TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED,
												 TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW };
	const unsigned int n_texture_targets = sizeof(texture_targets) / sizeof(texture_targets[0]);
	const unsigned int n_texture_types   = sizeof(texture_types) / sizeof(texture_types[0]);

	/* Iterate through all texture types supported by the test */
	for (unsigned int n_texture_type = 0; n_texture_type < n_texture_types; ++n_texture_type)
	{
		const _test_texture_type texture_type = texture_types[n_texture_type];

		/* Iterate through all texture targets supported by the test */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			_test_run		  new_test_run;
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Texture buffers are neither immutable nor mutable. In order to avoid testing
			 * them in both cases, let's assume they are immutable objects */
			if (texture_target == GL_TEXTURE_BUFFER && texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT)
			{
				continue;
			}

			/* Set up test run properties. Since we're only testing a single
			 * configuration, we can set these to predefined values..
			 */
			const int  n_levels_needed		 = 6;
			glw::GLint n_min_layer			 = 1;
			glw::GLint n_num_layers			 = 2;
			glw::GLint n_min_level			 = 2;
			glw::GLint n_num_levels			 = 3;
			int		   parent_texture_depth  = texture_depth;
			int		   parent_texture_height = texture_height;
			int		   parent_texture_width  = texture_width;

			new_test_run.texture_target = texture_target;
			new_test_run.texture_type   = texture_type;

			/* Take note of target-specific restrictions */
			if (texture_target == GL_TEXTURE_CUBE_MAP || texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				n_num_layers = 6 /* layer-faces */ * 2; /* as per spec */

				/* Make sure that cube face width matches its height */
				parent_texture_height = 64;
				parent_texture_width  = 64;

				/* Also change the depth so that there's at least a few layers
				 * we can use in the test for GL_TEXTURE_CUBE_MAP_ARRAY case
				 */
				parent_texture_depth = 64;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP)
			{
				/* Texture views created from a cube map texture should always
				 * use a minimum layer of zero
				 */
				n_min_layer  = 0;
				n_num_layers = 6;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				/* Slightly modify the values we'll use for <minlayer>
				 * and <numlayers> arguments passed to glTextureView() calls
				 * so that we can test the "view from view from texture" case
				 */
				n_min_layer = 0;
			}

			if (texture_target == GL_TEXTURE_1D || texture_target == GL_TEXTURE_2D ||
				texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_3D ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets are single-layer only. glTextureView()
				 * also requires <numlayers> argument to be set to 1 for them, so
				 * take this into account.
				 **/
				n_min_layer  = 0;
				n_num_layers = 1;
			}

			if (texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets do not support mip-maps */
				n_min_level = 0;
			}

			/* Initialize parent texture object */
			gl.genTextures(1, &new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

			gl.bindTexture(texture_target, new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

			if (texture_type != TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED)
			{
				TextureViewUtilities::initTextureStorage(gl, (texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT),
														 texture_target, parent_texture_depth, parent_texture_height,
														 parent_texture_width, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE,
														 n_levels_needed, n_cubemaps_needed, 0); /* bo_id */
			}

			/* Update expected view-specific property values to include interactions
			 * with immutable textures. */
			if (texture_type == TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				/* Set expected GL_TEXTURE_IMMUTABLE_LEVELS property value to the number
				 * of levels we'll be using for the immutable texture storage. For selected
				 * texture targets that do no take <levels> argument, we'll change this
				 * value on a case-by-case basis.
				 */
				new_test_run.expected_n_immutable_levels = n_levels_needed;

				/* Set expected GL_TEXTURE_VIEW_NUM_LAYERS property value to 1, as per GL spec.
				 * This value will be modified for selected texture targets */
				new_test_run.expected_n_num_layers = 1;

				/* Configured expected GL_TEXTURE_VIEW_NUM_LEVELS value as per GL spec */
				new_test_run.expected_n_num_levels = n_levels_needed;

				/* Initialize immutable texture storage */
				switch (texture_target)
				{
				case GL_TEXTURE_1D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_height;

					break;
				}

				case GL_TEXTURE_CUBE_MAP:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = 6;

					break;
				}

				case GL_TEXTURE_RECTANGLE:
				{
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE:
				{
					/* 2D multisample texture are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * value accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
				{
					/* 2D multisample array textures are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * values accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_CUBE_MAP_ARRAY:
				{
					const unsigned int actual_texture_depth = 6 /* layer-faces */ * n_cubemaps_needed;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = actual_texture_depth;

					break;
				}
				} /* switch (texture_target) */
			}

			/* Initialize the view(s) */
			if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				const unsigned int n_iterations =
					(texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) ? 2 : 1;

				for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
				{
					glw::GLuint* parent_id_ptr = (n_iteration == 0) ?
													 &new_test_run.parent_texture_object_id :
													 &new_test_run.texture_view_object_created_from_immutable_to_id;
					glw::GLuint* view_id_ptr = (n_iteration == 0) ?
												   &new_test_run.texture_view_object_created_from_immutable_to_id :
												   &new_test_run.texture_view_object_created_from_view_to_id;

					gl.genTextures(1, view_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

					gl.textureView(*view_id_ptr, new_test_run.texture_target, *parent_id_ptr,
								   GL_RGBA8, /* use the parent texture object's internalformat */
								   n_min_level, n_num_levels, n_min_layer, n_num_layers);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

					/* Query parent object's properties */
					glw::GLint parent_min_level			 = -1;
					glw::GLint parent_min_layer			 = -1;
					glw::GLint parent_num_layers		 = -1;
					glw::GLint parent_num_levels		 = -1;
					glw::GLint parent_n_immutable_levels = -1;

					gl.bindTexture(texture_target, *parent_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_IMMUTABLE_LEVELS, &parent_n_immutable_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LAYER, &parent_min_layer);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LEVEL, &parent_min_level);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LAYERS, &parent_num_layers);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LEVELS, &parent_num_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object");

					/* Update test run-specific expected values as per GL_ARB_texture_view extension specification */
					/*
					 * - TEXTURE_IMMUTABLE_LEVELS is set to the value of TEXTURE_IMMUTABLE_LEVELS
					 *   from the original texture.
					 */
					new_test_run.expected_n_immutable_levels = parent_n_immutable_levels;

					/*
					 * - TEXTURE_VIEW_MIN_LEVEL is set to <minlevel> plus the value of
					 *   TEXTURE_VIEW_MIN_LEVEL from the original texture.
					 */
					new_test_run.expected_n_min_level = n_min_level + parent_min_level;

					/*
					 * - TEXTURE_VIEW_MIN_LAYER is set to <minlayer> plus the value of
					 *   TEXTURE_VIEW_MIN_LAYER from the original texture.
					 */
					new_test_run.expected_n_min_layer = n_min_layer + parent_min_layer;

					/*
					 * - TEXTURE_VIEW_NUM_LAYERS is set to the lesser of <numlayers> and the
					 *   value of TEXTURE_VIEW_NUM_LAYERS from the original texture minus
					 *   <minlayer>.
					 *
					 */
					if ((parent_num_layers - n_min_layer) < n_num_layers)
					{
						new_test_run.expected_n_num_layers = parent_num_layers - n_min_layer;
					}
					else
					{
						new_test_run.expected_n_num_layers = n_num_layers;
					}

					/*
					 * - TEXTURE_VIEW_NUM_LEVELS is set to the lesser of <numlevels> and the
					 *   value of TEXTURE_VIEW_NUM_LEVELS from the original texture minus
					 *   <minlevels>.
					 *
					 */
					if ((parent_num_levels - n_min_level) < n_num_levels)
					{
						new_test_run.expected_n_num_levels = parent_num_levels - n_min_level;
					}
					else
					{
						new_test_run.expected_n_num_levels = n_num_levels;
					}
				} /* for (all iterations) */
			}	 /* if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
			 texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) */

			/* Store the descriptor */
			m_test_runs.push_back(new_test_run);
		} /* for (all texture targets) */
	}	 /* for (all texture types) */
}